

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# border_agent.cpp
# Opt level: O0

void __thiscall ot::commissioner::BorderAgent::State::State(State *this,uint32_t aState)

{
  uint32_t aState_local;
  State *this_local;
  
  State(this,(aState & 0x1c0) >> 6,(aState & 0x30) >> 4,(aState & 0xc) >> 2,(aState & 2) >> 1,
        aState & 1);
  return;
}

Assistant:

BorderAgent::State::State(uint32_t aState)
    : State((aState & kConnectionModeMask) >> kConnectionModeOffset,
            (aState & kThreadIfStatusMask) >> kThreadIfStatusOffset,
            (aState & kAvailabilityMask) >> kAvailabilityOffset,
            (aState & kBbrIsActiveMask) >> kBbrIsActiveOffset,
            (aState & kBbrIsPrimaryMask) >> kBbrIsPrimaryOffset)
{
}